

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_x_sq.cc
# Opt level: O0

int main(void)

{
  _Setprecision _Var1;
  ostream *poVar2;
  double dVar3;
  double dVar4;
  double x;
  double z;
  double dStack_18;
  int i;
  double sum;
  int N;
  
  dStack_18 = 0.0;
  for (z._4_4_ = 0; z._4_4_ < 1; z._4_4_ = z._4_4_ + 1) {
    dVar3 = random_double();
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      dVar3 = icd(dVar3);
      dVar4 = pdf(dVar3);
      dStack_18 = (dVar3 * dVar3) / dVar4 + dStack_18;
    }
  }
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
  _Var1 = std::setprecision(0xc);
  std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<((ostream *)&std::cout,"I = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dStack_18 / 1.0);
  std::operator<<(poVar2,'\n');
  return 0;
}

Assistant:

int main() {
    int N = 1;
    auto sum = 0.0;

    for (int i = 0; i < N; i++) {
        auto z = random_double();
        if (z == 0.0)  // Ignore zero to avoid NaNs
            continue;

        auto x = icd(z);
        sum += x*x / pdf(x);
    }

    std::cout << std::fixed << std::setprecision(12);
    std::cout << "I = " << (sum / N) << '\n';
}